

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Zyx_ManSetupVars(Zyx_Man_t *p)

{
  int iVar1;
  word *pwVar2;
  Bmc_EsPar_t *pBVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  pBVar3 = p->pPars;
  if (pBVar3->fMajority == 0) {
    pwVar2 = p->pTruth;
  }
  else {
    pwVar2 = Zyx_ManTruth(p,p->nObjs);
    pBVar3 = p->pPars;
  }
  for (iVar4 = pBVar3->nVars; iVar5 = p->nObjs, iVar4 < iVar5; iVar4 = iVar4 + 1) {
    Zyx_SetConstVar(p,(iVar4 - p->pPars->nVars) * (p->LutMask + 1),0);
  }
  for (iVar4 = p->pPars->nVars; iVar1 = iVar4, iVar4 < iVar5; iVar4 = iVar4 + 1) {
    for (; iVar1 < iVar5; iVar1 = iVar1 + 1) {
      Zyx_SetConstVar(p,iVar5 * (iVar4 - p->pPars->nVars) + p->TopoBase + iVar1,0);
      iVar5 = p->nObjs;
    }
  }
  Zyx_SetConstVar(p,(~p->pPars->nVars + iVar5) * iVar5 + p->TopoBase + iVar5 + -2,1);
  pBVar3 = p->pPars;
  if (pBVar3->fMajority != 0) {
    for (uVar7 = 0; (int)uVar7 < pBVar3->nVars; uVar7 = uVar7 + 1) {
      Zyx_SetConstVar(p,p->TopoBase + uVar7,(uint)(uVar7 < 3));
      pBVar3 = p->pPars;
    }
  }
  uVar8 = 0;
  while( true ) {
    iVar4 = pBVar3->nVars;
    uVar7 = (uint)uVar8;
    if (1 << ((byte)iVar4 & 0x1f) <= (int)uVar7) break;
    for (uVar6 = 0; (int)uVar6 < iVar4; uVar6 = uVar6 + 1) {
      Zyx_SetConstVar(p,p->nObjs * uVar7 + p->MintBase + uVar6,
                      (uint)((uVar7 >> (uVar6 & 0x1f) & 1) != 0));
      iVar4 = p->pPars->nVars;
    }
    Zyx_SetConstVar(p,p->nObjs * uVar7 + p->MintBase + p->nObjs + -1,
                    (uint)((pwVar2[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0));
    uVar8 = (ulong)(uVar7 + 1);
    pBVar3 = p->pPars;
  }
  return;
}

Assistant:

void Zyx_ManSetupVars( Zyx_Man_t * p )
{
    int i, k, m;
    word * pSpec = p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : p->pTruth;
    // set unused functionality vars to 0
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        Zyx_SetConstVar( p, Zyx_FuncVar(p, i, 0), 0 );
    // set unused topology vars
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( k = i; k < p->nObjs; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, i, k), 0 );
    // connect topmost node
    Zyx_SetConstVar( p, Zyx_TopoVar(p, p->nObjs-1, p->nObjs-2), 1 );
    // connect first node
    if ( p->pPars->fMajority )
        for ( k = 0; k < p->pPars->nVars; k++ )
            Zyx_SetConstVar( p, Zyx_TopoVar(p, p->pPars->nVars, k), k < 3 );
    // set minterm vars
    for ( m = 0; m < (1 << p->pPars->nVars); m++ )
    {
        for ( i = 0; i < p->pPars->nVars; i++ )
            Zyx_SetConstVar( p, Zyx_MintVar(p, m, i), (m >> i) & 1 );
        Zyx_SetConstVar( p, Zyx_MintVar(p, m, p->nObjs-1), Abc_TtGetBit(pSpec, m) );
    }
}